

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

__sighandler_t __thiscall
obs::signal<int_()>::~signal(signal<int_()> *this,int __sig,__sighandler_t __handler)

{
  __sighandler_t extraout_RAX;
  signal<int_()> *this_local;
  
  ~signal(this,__sig,__handler);
  operator_delete(this);
  return extraout_RAX;
}

Assistant:

~signal() {
    for (auto slot : m_slots)
      delete slot;
  }